

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_do_ofb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  grasshopper_w128_t *target;
  uint64_t *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  grasshopper_w128_t tmp;
  grasshopper_w128_t local_48;
  
  lVar5 = EVP_CIPHER_CTX_get_cipher_data();
  target = (grasshopper_w128_t *)EVP_CIPHER_CTX_buf_noconst(ctx);
  puVar6 = (uint64_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar4 = EVP_CIPHER_CTX_get_num(ctx);
  if ((int)uVar4 < 1) {
    uVar8 = 0;
  }
  else {
    uVar10 = (ulong)uVar4;
    uVar8 = 0;
    uVar9 = uVar10;
    if (inl != 0 && uVar4 < 0x10) {
      do {
        out[uVar8] = in[uVar8] ^ target->b[uVar9];
        uVar10 = uVar9 + 1;
        uVar8 = uVar8 + 1;
        if (0xe < uVar9) break;
        uVar9 = uVar10;
      } while (uVar8 < inl);
      in = in + uVar8;
      out = out + uVar8;
    }
    if (uVar10 != 0x10) goto LAB_0011ca91;
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  if (uVar8 + 0x10 < inl) {
    uVar9 = uVar8 + 0x10;
    do {
      uVar8 = uVar9;
      local_48.q[0] = *puVar6;
      local_48.q[1] = puVar6[1];
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)(lVar5 + 0x48),&local_48,target,
                 (grasshopper_w128_t *)(lVar5 + 0x188));
      uVar1 = target->d[1];
      uVar2 = target->d[2];
      uVar3 = target->d[3];
      *(uint32_t *)puVar6 = target->d[0];
      *(uint32_t *)((long)puVar6 + 4) = uVar1;
      *(uint32_t *)(puVar6 + 1) = uVar2;
      *(uint32_t *)((long)puVar6 + 0xc) = uVar3;
      lVar7 = 0;
      do {
        out[lVar7] = in[lVar7] ^ target->b[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      in = in + 0x10;
      out = out + 0x10;
      uVar9 = uVar8 + 0x10;
    } while (uVar8 + 0x10 < inl);
  }
  uVar10 = inl - uVar8;
  if (inl < uVar8 || uVar10 == 0) {
    uVar10 = 0;
  }
  else {
    local_48.q[0] = *puVar6;
    local_48.q[1] = puVar6[1];
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar5 + 0x48),&local_48,target,
               (grasshopper_w128_t *)(lVar5 + 0x188));
    uVar1 = target->d[1];
    uVar2 = target->d[2];
    uVar3 = target->d[3];
    *(uint32_t *)puVar6 = target->d[0];
    *(uint32_t *)((long)puVar6 + 4) = uVar1;
    *(uint32_t *)(puVar6 + 1) = uVar2;
    *(uint32_t *)((long)puVar6 + 0xc) = uVar3;
    uVar8 = 0;
    do {
      out[uVar8] = in[uVar8] ^ target->b[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    uVar10 = uVar10 & 0xffffffff;
  }
LAB_0011ca91:
  EVP_CIPHER_CTX_set_num(ctx,uVar10);
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_ofb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c = (gost_grasshopper_cipher_ctx *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    int num = EVP_CIPHER_CTX_num(ctx);
    size_t i = 0;
    size_t j;

    /* process partial block if any */
    if (num > 0) {
        for (j = (size_t)num, i = 0; j < GRASSHOPPER_BLOCK_SIZE && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            *out_ptr = buf[j] ^ (*in_ptr);
        }
        if (j == GRASSHOPPER_BLOCK_SIZE) {
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, (int)j);
            return 1;
        }
    }

    for (; i + GRASSHOPPER_BLOCK_SIZE <
         inl;
         i += GRASSHOPPER_BLOCK_SIZE, in_ptr +=
         GRASSHOPPER_BLOCK_SIZE, out_ptr += GRASSHOPPER_BLOCK_SIZE) {
        /*
         * block cipher current iv
         */
        /* Encrypt */
        gost_grasshopper_cnt_next(c, (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf);

        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        for (j = 0; j < GRASSHOPPER_BLOCK_SIZE; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
    }

    /* Process rest of buffer */
    if (i < inl) {
        gost_grasshopper_cnt_next(c, (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, (int)j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }

    return 1;
}